

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall wallet::WalletBatch::EraseLockedUTXO(WalletBatch *this,COutPoint *output)

{
  bool bVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
  *in_RDI;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  WalletBatch *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_74;
  WalletBatch local_50 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __x = &local_74;
  std::make_pair<transaction_identifier<false>const&,unsigned_int_const&>
            ((transaction_identifier<false> *)in_RDI,(uint *)__x);
  this_00 = local_50;
  std::make_pair<std::__cxx11::string_const&,std::pair<transaction_identifier<false>,unsigned_int>>
            (__x,(pair<transaction_identifier<false>,_unsigned_int> *)in_stack_ffffffffffffff48);
  bVar1 = EraseIC<std::pair<std::__cxx11::string,std::pair<transaction_identifier<false>,unsigned_int>>>
                    (this_00,in_RDI);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<transaction_identifier<false>,_unsigned_int>_>
  ::~pair(in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseLockedUTXO(const COutPoint& output)
{
    return EraseIC(std::make_pair(DBKeys::LOCKED_UTXO, std::make_pair(output.hash, output.n)));
}